

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fft.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *result;
  char **argv_local;
  int argc_local;
  
  pcVar1 = all_tests();
  if (pcVar1 == (char *)0x0) {
    printf("ALL TESTS PASSED\n");
  }
  else {
    printf("%s\n",pcVar1);
  }
  printf("Tests run: %d\n",(ulong)(uint)tests_run);
  return (int)(pcVar1 != (char *)0x0);
}

Assistant:

int main(int argc, char **argv) {
     char *result = all_tests();
     if (result != 0) {
         printf("%s\n", result);
     }
     else {
         printf("ALL TESTS PASSED\n");
     }
     printf("Tests run: %d\n", tests_run);

     return result != 0;
}